

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf,
                  PerConfig perConfig)

{
  cmMakefile *pcVar1;
  char *__s1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  string *psVar6;
  cmGlobalGenerator *pcVar7;
  cmValue cVar8;
  cmState *pcVar9;
  _Base_ptr p_Var10;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var11;
  pointer pbVar12;
  long lVar13;
  string_view arg;
  string_view str;
  string genName;
  anon_class_24_3_0d5b69a6 initProp;
  string vsGlobal;
  anon_class_24_3_0d5b69a6 initPropValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string property;
  string configUpper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string defKey;
  
  std::make_unique<cmTargetInternals>();
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTarget.cxx"
                  ,0x1c1,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *, PerConfig)"
                 );
  }
  _Var11._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var11._M_head_impl)->TargetType = type;
  (_Var11._M_head_impl)->Makefile = mf;
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Name);
  _Var11._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var11._M_head_impl)->IsGeneratorProvided = false;
  (_Var11._M_head_impl)->HaveInstallRule = false;
  (_Var11._M_head_impl)->IsDLLPlatform = false;
  (_Var11._M_head_impl)->IsAIX = false;
  (_Var11._M_head_impl)->IsImportedTarget = vis - VisibilityImported < 2;
  (_Var11._M_head_impl)->IsAndroid = false;
  (_Var11._M_head_impl)->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  (_Var11._M_head_impl)->BuildInterfaceIncludesAppended = false;
  (_Var11._M_head_impl)->PerConfig = perConfig == Yes;
  pcVar1 = (_Var11._M_head_impl)->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genName,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&vsGlobal);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&genName);
  ((this->impl)._M_t.
   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
   super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsDLLPlatform =
       psVar6->_M_string_length != 0;
  std::__cxx11::string::~string((string *)&genName);
  pcVar1 = ((this->impl)._M_t.
            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
            super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genName,"CMAKE_SYSTEM_NAME",(allocator<char> *)&vsGlobal);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&genName);
  std::__cxx11::string::~string((string *)&genName);
  bVar2 = std::operator==(psVar6,"AIX");
  bVar3 = true;
  if (!bVar2) {
    bVar3 = std::operator==(psVar6,"OS400");
  }
  _Var11._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var11._M_head_impl)->IsAIX = bVar3;
  pcVar1 = (_Var11._M_head_impl)->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genName,"CMAKE_SYSTEM_NAME",(allocator<char> *)&vsGlobal);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&genName);
  bVar2 = std::operator==(psVar6,"Android");
  ((this->impl)._M_t.
   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
   super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsAndroid = bVar2;
  std::__cxx11::string::~string((string *)&genName);
  defKey._M_dataplus._M_p = (pointer)&defKey.field_2;
  defKey._M_string_length = 0;
  defKey.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&defKey);
  std::__cxx11::string::append((char *)&defKey);
  _Var11._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  initProp.this = this;
  initProp.mf = mf;
  initProp.defKey = &defKey;
  initPropValue.this = this;
  initPropValue.mf = mf;
  initPropValue.defKey = &defKey;
  if (((_Var11._M_head_impl)->IsImportedTarget == false) && ((_Var11._M_head_impl)->TargetType < 5))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_STANDARD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_STANDARD_REQUIRED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_EXTENSIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_VISIBILITY_PRESET",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJC_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJC_STANDARD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJC_STANDARD_REQUIRED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJC_EXTENSIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJC_VISIBILITY_PRESET",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_STANDARD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_STANDARD_REQUIRED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_EXTENSIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_VISIBILITY_PRESET",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJCXX_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJCXX_STANDARD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJCXX_STANDARD_REQUIRED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJCXX_EXTENSIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJCXX_VISIBILITY_PRESET",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_STANDARD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_STANDARD_REQUIRED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_EXTENSIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_VISIBILITY_PRESET",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"HIP_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"HIP_STANDARD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"HIP_STANDARD_REQUIRED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"HIP_EXTENSIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"HIP_VISIBILITY_PRESET",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_API",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_API_MIN",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_ARCH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_STL_TYPE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_SKIP_ANT_STEP",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_PROCESS_MAX",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_PROGUARD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_PROGUARD_CONFIG_PATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_SECURE_PROPS_PATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_NATIVE_LIB_DIRECTORIES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_NATIVE_LIB_DEPENDENCIES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_JAVA_SOURCE_DIR",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_JAR_DIRECTORIES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_JAR_DEPENDENCIES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_ASSETS_DIRECTORIES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_ANT_ADDITIONAL_OPTIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"BUILD_RPATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"BUILD_RPATH_USE_ORIGIN",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"INSTALL_NAME_DIR",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"INSTALL_REMOVE_ENVIRONMENT_RPATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"INSTALL_RPATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"INSTALL_RPATH_USE_LINK_PATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"OFF");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"INTERPROCEDURAL_OPTIMIZATION",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"SKIP_BUILD_RPATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"OFF");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"OFF");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ARCHIVE_OUTPUT_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"LIBRARY_OUTPUT_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"RUNTIME_OUTPUT_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"PDB_OUTPUT_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"COMPILE_PDB_OUTPUT_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"FRAMEWORK",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"FRAMEWORK_MULTI_CONFIG_POSTFIX",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"Fortran_FORMAT",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"Fortran_MODULE_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"Fortran_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"Fortran_PREPROCESS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"Fortran_VISIBILITY_PRESET",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"GNUtoMS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OSX_ARCHITECTURES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"IOS_INSTALL_COMBINED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOMOC",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOUIC",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTORCC",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOGEN_PARALLEL",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOMOC_COMPILER_PREDEFINES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOMOC_DEPEND_FILTERS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOMOC_MACRO_NAMES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOMOC_MOC_OPTIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOUIC_OPTIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOMOC_PATH_PREFIX",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTOUIC_SEARCH_PATHS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AUTORCC_OPTIONS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"LINK_DEPENDS_NO_SHARED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"MSVC_DEBUG_INFORMATION_FORMAT",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"MSVC_RUNTIME_LIBRARY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"WATCOM_RUNTIME_LIBRARY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"WIN32_EXECUTABLE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"MACOSX_BUNDLE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"MACOSX_RPATH",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"NO_SYSTEM_FROM_IMPORTED",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"BUILD_WITH_INSTALL_NAME_DIR",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_CLANG_TIDY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_CPPLINT",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_CPPCHECK",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_INCLUDE_WHAT_YOU_USE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"C_LINKER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"LINK_WHAT_YOU_USE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_CLANG_TIDY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_CPPLINT",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_CPPCHECK",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_INCLUDE_WHAT_YOU_USE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CXX_LINKER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_RUNTIME_LIBRARY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CUDA_ARCHITECTURES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"HIP_RUNTIME_LIBRARY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"HIP_ARCHITECTURES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"VISIBILITY_INLINES_HIDDEN",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"JOB_POOL_COMPILE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"JOB_POOL_LINK",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"JOB_POOL_PRECOMPILE_HEADER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ISPC_COMPILER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ISPC_HEADER_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ISPC_HEADER_SUFFIX",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"_ispc.h");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ISPC_INSTRUCTION_SETS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"LINK_SEARCH_START_STATIC",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"LINK_SEARCH_END_STATIC",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJC_CLANG_TIDY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJC_LINKER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJCXX_CLANG_TIDY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OBJCXX_LINKER_LAUNCHER",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"Swift_LANGUAGE_VERSION",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"Swift_MODULE_DIRECTORY",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"VS_JUST_MY_CODE_DEBUGGING",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"VS_NO_COMPILE_BATCHING",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"DISABLE_PRECOMPILE_HEADERS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"UNITY_BUILD",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"UNITY_BUILD_UNIQUE_ID",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"OPTIMIZE_DEPENDENCIES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"EXPORT_COMPILE_COMMANDS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"COMPILE_WARNING_AS_ERROR",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"UNITY_BUILD_BATCH_SIZE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"8");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"UNITY_BUILD_MODE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"BATCH");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"PCH_WARN_INVALID",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"ON");
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"PCH_INSTANTIATE_TEMPLATES",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&genName,"ON");
    std::__cxx11::string::~string((string *)&genName);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genName,"FOLDER",(allocator<char> *)&vsGlobal);
  cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
  std::__cxx11::string::~string((string *)&genName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genName,"VERIFY_INTERFACE_HEADER_SETS",(allocator<char> *)&vsGlobal);
  cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
  std::__cxx11::string::~string((string *)&genName);
  pcVar7 = GetGlobalGenerator(this);
  iVar4 = (*pcVar7->_vptr_cmGlobalGenerator[0x27])(pcVar7);
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"XCODE_GENERATE_SCHEME",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
  }
  if (1 < ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType - 5) {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configNames,mf,ExcludeEmptyConfig);
    for (pbVar12 = configNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar12 !=
        configNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
      cmsys::SystemTools::UpperCase(&configUpper,pbVar12);
      for (lVar13 = 0; lVar13 != 0x38; lVar13 = lVar13 + 8) {
        __s1 = *(char **)((long)&cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*,cmTarget::PerConfig)
                                 ::configProps + lVar13);
        if ((((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 7) ||
           (iVar4 = strcmp(__s1,"MAP_IMPORTED_CONFIG_"), iVar4 == 0)) {
          genName._M_dataplus._M_p = (pointer)strlen(__s1);
          genName._M_string_length = (size_type)__s1;
          vsGlobal._M_dataplus._M_p = (pointer)configUpper._M_string_length;
          vsGlobal._M_string_length = (size_type)configUpper._M_dataplus._M_p;
          cmStrCat<>(&property,(cmAlphaNum *)&genName,(cmAlphaNum *)&vsGlobal);
          cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&property);
          std::__cxx11::string::~string((string *)&property);
        }
      }
      iVar4 = ((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
      if ((iVar4 != 0) && (iVar4 != 7)) {
        cmsys::SystemTools::UpperCase((string *)&props,pbVar12);
        genName._M_string_length =
             (size_type)
             props.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        genName._M_dataplus._M_p =
             (pointer)props.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        vsGlobal._M_dataplus._M_p = (pointer)0x8;
        vsGlobal._M_string_length = (long)"FRAMEWORK_MULTI_CONFIG_POSTFIX" + 0x16;
        cmStrCat<>(&property,(cmAlphaNum *)&genName,(cmAlphaNum *)&vsGlobal);
        std::__cxx11::string::~string((string *)&props);
        cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&property);
        std::__cxx11::string::~string((string *)&property);
        iVar4 = ((this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
      }
      if (iVar4 - 1U < 2) {
        genName._M_string_length = (size_type)"FRAMEWORK_MULTI_CONFIG_POSTFIX_";
        genName._M_dataplus._M_p = (pointer)0x1f;
        cmsys::SystemTools::UpperCase((string *)&props,pbVar12);
        vsGlobal._M_dataplus._M_p =
             (pointer)props.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        vsGlobal._M_string_length =
             (size_type)
             props.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        cmStrCat<>(&property,(cmAlphaNum *)&genName,(cmAlphaNum *)&vsGlobal);
        std::__cxx11::string::~string((string *)&props);
        cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&property);
        std::__cxx11::string::~string((string *)&property);
      }
      std::__cxx11::string::~string((string *)&configUpper);
    }
    if (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == false)
    {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&genName,"LINK_LIBRARIES_ONLY_TARGETS",(allocator<char> *)&vsGlobal);
      cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
      std::__cxx11::string::~string((string *)&genName);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configNames);
  }
  cmMakefile::GetBacktrace((cmMakefile *)&genName);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Backtrace,
              (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&genName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&genName._M_string_length);
  _Var11._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var11._M_head_impl)->IsImportedTarget == false) {
    genName._0_16_ =
         cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_((_Var11._M_head_impl)->Makefile);
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&(_Var11._M_head_impl)->IncludeDirectoriesEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)&genName);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    pcVar1 = (_Var11._M_head_impl)->Makefile;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(_Var11._M_head_impl)->SystemIncludeDirectories,
               (pcVar1->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,&(pcVar1->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
                        _M_header);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    genName._0_16_ =
         cmMakefile::GetCompileOptionsEntries_abi_cxx11_((_Var11._M_head_impl)->Makefile);
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&(_Var11._M_head_impl)->CompileOptionsEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)&genName);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    genName._0_16_ = cmMakefile::GetLinkOptionsEntries_abi_cxx11_((_Var11._M_head_impl)->Makefile);
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&(_Var11._M_head_impl)->LinkOptionsEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)&genName);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    genName._0_16_ =
         cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_((_Var11._M_head_impl)->Makefile);
    ::cm::
    append<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
              (&(_Var11._M_head_impl)->LinkDirectoriesEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)&genName);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  TVar5 = (_Var11._M_head_impl)->TargetType;
  if (TVar5 == EXECUTABLE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ANDROID_GUI",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"CROSSCOMPILING_EMULATOR",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"ENABLE_EXPORTS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    TVar5 = (_Var11._M_head_impl)->TargetType;
  }
  if ((TVar5 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"POSITION_INDEPENDENT_CODE",(allocator<char> *)&vsGlobal);
    StoreProperty<char_const*>(this,&genName,"True");
LAB_001cd93d:
    std::__cxx11::string::~string((string *)&genName);
  }
  else if ((TVar5 < UTILITY) && ((_Var11._M_head_impl)->IsImportedTarget == false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"POSITION_INDEPENDENT_CODE",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    goto LAB_001cd93d;
  }
  _Var11._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if (((_Var11._M_head_impl)->TargetType & 0xfffffffd) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"AIX_EXPORT_ALL_SYMBOLS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"WINDOWS_EXPORT_ALL_SYMBOLS",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  cmMakefile::RecordPolicies((_Var11._M_head_impl)->Makefile,&(_Var11._M_head_impl)->PolicyMap);
  _Var11._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var11._M_head_impl)->TargetType == 7) {
    cmPolicies::PolicyMap::Set(&(_Var11._M_head_impl)->PolicyMap,CMP0022,NEW);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  if ((_Var11._M_head_impl)->IsImportedTarget == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"DOTNET_SDK",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    _Var11._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  if ((int)(_Var11._M_head_impl)->TargetType < 7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"DOTNET_TARGET_FRAMEWORK",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"DOTNET_TARGET_FRAMEWORK_VERSION",(allocator<char> *)&vsGlobal);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&genName);
    std::__cxx11::string::~string((string *)&genName);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genName,"CMAKE_VS_GLOBALS",(allocator<char> *)&vsGlobal);
  cVar8 = cmMakefile::GetDefinition(mf,&genName);
  std::__cxx11::string::~string((string *)&genName);
  if (cVar8.Value != (string *)0x0) {
    pcVar7 = cmMakefile::GetGlobalGenerator(mf);
    (*pcVar7->_vptr_cmGlobalGenerator[3])(&genName,pcVar7);
    str._M_str = genName._M_dataplus._M_p;
    str._M_len = genName._M_string_length;
    bVar2 = cmHasLiteralPrefix<14ul>(str,(char (*) [14])"Visual Studio");
    if (bVar2) {
      arg._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar8.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&props,arg,false);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vsGlobal,"VS_GLOBAL_",(allocator<char> *)&configUpper);
      for (pbVar12 = props.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar12 !=
          props.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
        lVar13 = std::__cxx11::string::find((char)pbVar12,0x3d);
        if (lVar13 != -1) {
          std::__cxx11::string::substr((ulong)&property,(ulong)pbVar12);
          std::operator+(&configUpper,&vsGlobal,&property);
          std::__cxx11::string::~string((string *)&property);
          std::__cxx11::string::substr((ulong)&property,(ulong)pbVar12);
          cmTarget::anon_class_24_3_0d5b69a6::operator()
                    (&initPropValue,&configUpper,property._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&property);
          std::__cxx11::string::~string((string *)&configUpper);
        }
      }
      std::__cxx11::string::~string((string *)&vsGlobal);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&props);
    }
    std::__cxx11::string::~string((string *)&genName);
  }
  if (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&genName,"SYSTEM",(allocator<char> *)&vsGlobal);
    bVar2 = cmMakefile::GetPropertyAsBool(mf,&genName);
    std::__cxx11::string::~string((string *)&genName);
    if (!bVar2) goto LAB_001cdc66;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&genName,"SYSTEM",(allocator<char> *)&vsGlobal);
  StoreProperty<char_const*>(this,&genName,"ON");
  std::__cxx11::string::~string((string *)&genName);
LAB_001cdc66:
  pcVar9 = cmMakefile::GetState(mf);
  for (p_Var10 = (pcVar9->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      (_Rb_tree_header *)p_Var10 !=
      &(pcVar9->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    if (((p_Var10[2]._M_color == _S_red) && (p_Var10[4]._M_right != (_Base_ptr)0x0)) &&
       (cVar8 = cmMakefile::GetDefinition(mf,(string *)&p_Var10[4]._M_left),
       cVar8.Value != (string *)0x0)) {
      StoreProperty<cmValue>(this,(string *)(p_Var10 + 1),cVar8);
    }
  }
  std::__cxx11::string::~string((string *)&defKey);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf, PerConfig perConfig)
  : impl(cm::make_unique<cmTargetInternals>())
{
  assert(mf);
  this->impl->TargetType = type;
  this->impl->Makefile = mf;
  this->impl->Name = name;
  this->impl->IsGeneratorProvided = false;
  this->impl->HaveInstallRule = false;
  this->impl->IsDLLPlatform = false;
  this->impl->IsAIX = false;
  this->impl->IsAndroid = false;
  this->impl->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->impl->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->impl->BuildInterfaceIncludesAppended = false;
  this->impl->PerConfig = (perConfig == PerConfig::Yes);

  // Check whether this is a DLL platform.
  this->impl->IsDLLPlatform =
    !this->impl->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")
       .empty();

  // Check whether we are targeting AIX.
  {
    std::string const& systemName =
      this->impl->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME");
    this->impl->IsAIX = (systemName == "AIX" || systemName == "OS400");
  }

  // Check whether we are targeting an Android platform.
  this->impl->IsAndroid = (this->impl->Makefile->GetSafeDefinition(
                             "CMAKE_SYSTEM_NAME") == "Android");

  std::string defKey;
  defKey.reserve(128);
  defKey += "CMAKE_";
  auto initProp = [this, mf, &defKey](const std::string& property) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (cmValue value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    }
  };
  auto initPropValue = [this, mf, &defKey](const std::string& property,
                                           const char* default_value) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (cmValue value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    } else if (default_value) {
      this->SetProperty(property, default_value);
    }
  };

  // Setup default property values.
  if (this->CanCompileSources()) {

    SETUP_COMMON_LANGUAGE_PROPERTIES(C);
    SETUP_COMMON_LANGUAGE_PROPERTIES(OBJC);
    SETUP_COMMON_LANGUAGE_PROPERTIES(CXX);
    SETUP_COMMON_LANGUAGE_PROPERTIES(OBJCXX);
    SETUP_COMMON_LANGUAGE_PROPERTIES(CUDA);
    SETUP_COMMON_LANGUAGE_PROPERTIES(HIP);

    initProp("ANDROID_API");
    initProp("ANDROID_API_MIN");
    initProp("ANDROID_ARCH");
    initProp("ANDROID_STL_TYPE");
    initProp("ANDROID_SKIP_ANT_STEP");
    initProp("ANDROID_PROCESS_MAX");
    initProp("ANDROID_PROGUARD");
    initProp("ANDROID_PROGUARD_CONFIG_PATH");
    initProp("ANDROID_SECURE_PROPS_PATH");
    initProp("ANDROID_NATIVE_LIB_DIRECTORIES");
    initProp("ANDROID_NATIVE_LIB_DEPENDENCIES");
    initProp("ANDROID_JAVA_SOURCE_DIR");
    initProp("ANDROID_JAR_DIRECTORIES");
    initProp("ANDROID_JAR_DEPENDENCIES");
    initProp("ANDROID_ASSETS_DIRECTORIES");
    initProp("ANDROID_ANT_ADDITIONAL_OPTIONS");
    initProp("BUILD_RPATH");
    initProp("BUILD_RPATH_USE_ORIGIN");
    initProp("INSTALL_NAME_DIR");
    initProp("INSTALL_REMOVE_ENVIRONMENT_RPATH");
    initPropValue("INSTALL_RPATH", "");
    initPropValue("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    initProp("INTERPROCEDURAL_OPTIMIZATION");
    initPropValue("SKIP_BUILD_RPATH", "OFF");
    initPropValue("BUILD_WITH_INSTALL_RPATH", "OFF");
    initProp("ARCHIVE_OUTPUT_DIRECTORY");
    initProp("LIBRARY_OUTPUT_DIRECTORY");
    initProp("RUNTIME_OUTPUT_DIRECTORY");
    initProp("PDB_OUTPUT_DIRECTORY");
    initProp("COMPILE_PDB_OUTPUT_DIRECTORY");
    initProp("FRAMEWORK");
    initProp("FRAMEWORK_MULTI_CONFIG_POSTFIX");
    initProp("Fortran_FORMAT");
    initProp("Fortran_MODULE_DIRECTORY");
    initProp("Fortran_COMPILER_LAUNCHER");
    initProp("Fortran_PREPROCESS");
    initProp("Fortran_VISIBILITY_PRESET");
    initProp("GNUtoMS");
    initProp("OSX_ARCHITECTURES");
    initProp("IOS_INSTALL_COMBINED");
    initProp("AUTOMOC");
    initProp("AUTOUIC");
    initProp("AUTORCC");
    initProp("AUTOGEN_ORIGIN_DEPENDS");
    initProp("AUTOGEN_PARALLEL");
    initProp("AUTOMOC_COMPILER_PREDEFINES");
    initProp("AUTOMOC_DEPEND_FILTERS");
    initProp("AUTOMOC_MACRO_NAMES");
    initProp("AUTOMOC_MOC_OPTIONS");
    initProp("AUTOUIC_OPTIONS");
    initProp("AUTOMOC_PATH_PREFIX");
    initProp("AUTOUIC_SEARCH_PATHS");
    initProp("AUTORCC_OPTIONS");
    initProp("LINK_DEPENDS_NO_SHARED");
    initProp("LINK_INTERFACE_LIBRARIES");
    initProp("MSVC_DEBUG_INFORMATION_FORMAT");
    initProp("MSVC_RUNTIME_LIBRARY");
    initProp("WATCOM_RUNTIME_LIBRARY");
    initProp("WIN32_EXECUTABLE");
    initProp("MACOSX_BUNDLE");
    initProp("MACOSX_RPATH");
    initProp("NO_SYSTEM_FROM_IMPORTED");
    initProp("BUILD_WITH_INSTALL_NAME_DIR");
    initProp("C_CLANG_TIDY");
    initProp("C_CPPLINT");
    initProp("C_CPPCHECK");
    initProp("C_INCLUDE_WHAT_YOU_USE");
    initProp("C_LINKER_LAUNCHER");
    initProp("LINK_WHAT_YOU_USE");
    initProp("CXX_CLANG_TIDY");
    initProp("CXX_CPPLINT");
    initProp("CXX_CPPCHECK");
    initProp("CXX_INCLUDE_WHAT_YOU_USE");
    initProp("CXX_LINKER_LAUNCHER");
    initProp("CUDA_SEPARABLE_COMPILATION");
    initProp("CUDA_RESOLVE_DEVICE_SYMBOLS");
    initProp("CUDA_RUNTIME_LIBRARY");
    initProp("CUDA_ARCHITECTURES");
    initProp("HIP_RUNTIME_LIBRARY");
    initProp("HIP_ARCHITECTURES");
    initProp("VISIBILITY_INLINES_HIDDEN");
    initProp("JOB_POOL_COMPILE");
    initProp("JOB_POOL_LINK");
    initProp("JOB_POOL_PRECOMPILE_HEADER");
    initProp("ISPC_COMPILER_LAUNCHER");
    initProp("ISPC_HEADER_DIRECTORY");
    initPropValue("ISPC_HEADER_SUFFIX", "_ispc.h");
    initProp("ISPC_INSTRUCTION_SETS");
    initProp("LINK_SEARCH_START_STATIC");
    initProp("LINK_SEARCH_END_STATIC");
    initProp("OBJC_CLANG_TIDY");
    initProp("OBJC_LINKER_LAUNCHER");
    initProp("OBJCXX_CLANG_TIDY");
    initProp("OBJCXX_LINKER_LAUNCHER");
    initProp("Swift_LANGUAGE_VERSION");
    initProp("Swift_MODULE_DIRECTORY");
    initProp("VS_JUST_MY_CODE_DEBUGGING");
    initProp("VS_NO_COMPILE_BATCHING");
    initProp("DISABLE_PRECOMPILE_HEADERS");
    initProp("UNITY_BUILD");
    initProp("UNITY_BUILD_UNIQUE_ID");
    initProp("OPTIMIZE_DEPENDENCIES");
    initProp("EXPORT_COMPILE_COMMANDS");
    initProp("COMPILE_WARNING_AS_ERROR");
    initPropValue("UNITY_BUILD_BATCH_SIZE", "8");
    initPropValue("UNITY_BUILD_MODE", "BATCH");
    initPropValue("PCH_WARN_INVALID", "ON");
    initPropValue("PCH_INSTANTIATE_TEMPLATES", "ON");

#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN");
      initProp("XCODE_SCHEME_DEBUG_DOCUMENT_VERSIONING");
      initProp("XCODE_SCHEME_ENABLE_GPU_FRAME_CAPTURE_MODE");
      initProp("XCODE_SCHEME_THREAD_SANITIZER");
      initProp("XCODE_SCHEME_THREAD_SANITIZER_STOP");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP");
      initProp("XCODE_SCHEME_LAUNCH_CONFIGURATION");
      initProp("XCODE_SCHEME_ENABLE_GPU_API_VALIDATION");
      initProp("XCODE_SCHEME_ENABLE_GPU_SHADER_VALIDATION");
      initProp("XCODE_SCHEME_WORKING_DIRECTORY");
      initProp("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER");
      initProp("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP");
      initProp("XCODE_SCHEME_MALLOC_SCRIBBLE");
      initProp("XCODE_SCHEME_MALLOC_GUARD_EDGES");
      initProp("XCODE_SCHEME_GUARD_MALLOC");
      initProp("XCODE_SCHEME_LAUNCH_MODE");
      initProp("XCODE_SCHEME_ZOMBIE_OBJECTS");
      initProp("XCODE_SCHEME_MALLOC_STACK");
      initProp("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE");
      initProp("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS");
      initProp("XCODE_SCHEME_ENVIRONMENT");
      initPropValue("XCODE_LINK_BUILD_PHASE_MODE", "NONE");
    }
#endif
  }

  initProp("FOLDER");
  initProp("VERIFY_INTERFACE_HEADER_SETS");

  if (this->GetGlobalGenerator()->IsXcode()) {
    initProp("XCODE_GENERATE_SCHEME");
  }

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY &&
      this->GetType() != cmStateEnums::GLOBAL_TARGET) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    // Collect the set of configuration types.
    std::vector<std::string> configNames =
      mf->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->impl->TargetType == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = cmStrCat(prop, configUpper);
        initProp(property);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->impl->TargetType != cmStateEnums::EXECUTABLE &&
          this->impl->TargetType != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property =
          cmStrCat(cmSystemTools::UpperCase(configName), "_POSTFIX");
        initProp(property);
      }

      if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
          this->impl->TargetType == cmStateEnums::STATIC_LIBRARY) {
        std::string property = cmStrCat("FRAMEWORK_MULTI_CONFIG_POSTFIX_",
                                        cmSystemTools::UpperCase(configName));
        initProp(property);
      }
    }
    if (!this->IsImported()) {
      initProp("LINK_LIBRARIES_ONLY_TARGETS");
    }
  }

  // Save the backtrace of target construction.
  this->impl->Backtrace = this->impl->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    cm::append(this->impl->IncludeDirectoriesEntries,
               this->impl->Makefile->GetIncludeDirectoriesEntries());

    {
      auto const& sysInc = this->impl->Makefile->GetSystemIncludeDirectories();
      this->impl->SystemIncludeDirectories.insert(sysInc.begin(),
                                                  sysInc.end());
    }

    cm::append(this->impl->CompileOptionsEntries,
               this->impl->Makefile->GetCompileOptionsEntries());

    cm::append(this->impl->LinkOptionsEntries,
               this->impl->Makefile->GetLinkOptionsEntries());

    cm::append(this->impl->LinkDirectoriesEntries,
               this->impl->Makefile->GetLinkDirectoriesEntries());
  }

  if (this->impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("ANDROID_GUI");
    initProp("CROSSCOMPILING_EMULATOR");
    initProp("ENABLE_EXPORTS");
  }
  if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      this->impl->TargetType == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  } else if (this->CanCompileSources()) {
    initProp("POSITION_INDEPENDENT_CODE");
  }
  if (this->impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      this->impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("AIX_EXPORT_ALL_SYMBOLS");
    initProp("WINDOWS_EXPORT_ALL_SYMBOLS");
  }

  // Record current policies for later use.
  this->impl->Makefile->RecordPolicies(this->impl->PolicyMap);

  if (this->impl->TargetType == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->impl->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (!this->IsImported()) {
    initProp("DOTNET_SDK");
  }

  if (this->impl->TargetType <= cmStateEnums::GLOBAL_TARGET) {
    initProp("DOTNET_TARGET_FRAMEWORK");
    initProp("DOTNET_TARGET_FRAMEWORK_VERSION");
  }

  // check for "CMAKE_VS_GLOBALS" variable and set up target properties
  // if any
  cmValue globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
  if (globals) {
    const std::string genName = mf->GetGlobalGenerator()->GetName();
    if (cmHasLiteralPrefix(genName, "Visual Studio")) {
      std::vector<std::string> props = cmExpandedList(*globals);
      const std::string vsGlobal = "VS_GLOBAL_";
      for (const std::string& i : props) {
        // split NAME=VALUE
        const std::string::size_type assignment = i.find('=');
        if (assignment != std::string::npos) {
          const std::string propName = vsGlobal + i.substr(0, assignment);
          const std::string propValue = i.substr(assignment + 1);
          initPropValue(propName, propValue.c_str());
        }
      }
    }
  }

  if (this->IsImported() || mf->GetPropertyAsBool("SYSTEM")) {
    this->SetProperty("SYSTEM", "ON");
  }

  for (auto const& prop : mf->GetState()->GetPropertyDefinitions().GetMap()) {
    if (prop.first.second == cmProperty::TARGET &&
        !prop.second.GetInitializeFromVariable().empty()) {
      if (auto value =
            mf->GetDefinition(prop.second.GetInitializeFromVariable())) {
        this->SetProperty(prop.first.first, value);
      }
    }
  }
}